

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

DecodeStatus DecodeINSVE_DF_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  sbyte sVar4;
  code *pcVar5;
  
  if ((insn & 0x300000) == 0) {
    pcVar5 = DecodeMSA128BRegisterClass;
    sVar4 = 4;
  }
  else if ((insn & 0x380000) == 0x200000) {
    pcVar5 = DecodeMSA128HRegisterClass;
    sVar4 = 3;
  }
  else {
    sVar4 = 0;
    if ((insn & 0x3c0000) == 0x300000) {
      pcVar5 = DecodeMSA128WRegisterClass;
      sVar4 = 2;
    }
    else {
      if ((insn & 0x3e0000) != 0x380000) {
        bVar1 = true;
        pcVar5 = (code *)0x0;
        goto LAB_0018d7b1;
      }
      pcVar5 = DecodeMSA128DRegisterClass;
      sVar4 = 1;
    }
  }
  bVar1 = false;
LAB_0018d7b1:
  if (!bVar1) {
    uVar3 = insn >> 6 & 0x1f;
    iVar2 = (*pcVar5)(MI,uVar3);
    if ((iVar2 != 0) && (iVar2 = (*pcVar5)(MI,uVar3,Address,Decoder), iVar2 != 0)) {
      MCOperand_CreateImm0(MI,(ulong)(insn >> 0x10 & ~(-1 << sVar4)));
      iVar2 = (*pcVar5)(MI,insn >> 0xb & 0x1f,Address,Decoder);
      if (iVar2 != 0) {
        MCOperand_CreateImm0(MI,0);
        return MCDisassembler_Success;
      }
      return MCDisassembler_Fail;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeINSVE_DF_4(MCInst *MI, uint32_t insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	typedef DecodeStatus (*DecodeFN)(MCInst *, unsigned, uint64_t, MCRegisterInfo *);
	// The size of the n field depends on the element size
	// The register class also depends on this.
	uint32_t tmp = fieldFromInstruction(insn, 17, 5);
	unsigned NSize = 0;
	DecodeFN RegDecoder = NULL;

	if ((tmp & 0x18) == 0x00) { // INSVE_B
		NSize = 4;
		RegDecoder = DecodeMSA128BRegisterClass;
	} else if ((tmp & 0x1c) == 0x10) { // INSVE_H
		NSize = 3;
		RegDecoder = DecodeMSA128HRegisterClass;
	} else if ((tmp & 0x1e) == 0x18) { // INSVE_W
		NSize = 2;
		RegDecoder = DecodeMSA128WRegisterClass;
	} else if ((tmp & 0x1f) == 0x1c) { // INSVE_D
		NSize = 1;
		RegDecoder = DecodeMSA128DRegisterClass;
	} //else llvm_unreachable("Invalid encoding");

	//assert(NSize != 0 && RegDecoder != nullptr);
	if (NSize == 0 || RegDecoder == NULL)
		return MCDisassembler_Fail;

	if (RegDecoder == NULL)
		return MCDisassembler_Fail;

	// $wd
	tmp = fieldFromInstruction(insn, 6, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $wd_in
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n
	tmp = fieldFromInstruction(insn, 16, NSize);
	MCOperand_CreateImm0(MI, tmp);

	// $ws
	tmp = fieldFromInstruction(insn, 11, 5);
	if (RegDecoder(MI, tmp, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	// $n2
	MCOperand_CreateImm0(MI, 0);

	return MCDisassembler_Success;
}